

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O2

void Cmd_invprev(FCommandLine *argv,APlayerPawn *who,int key)

{
  TObjPtr<AInventory> *obj;
  FFont *font;
  DBaseStatusBar *this;
  AInventory *pAVar1;
  AInventory *pAVar2;
  DHUDMessageFadeOut *this_00;
  char *text;
  
  if (who != (APlayerPawn *)0x0) {
    obj = &who->InvSel;
    pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj);
    if (pAVar1 != (AInventory *)0x0) {
      pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj);
      pAVar1 = AInventory::PrevInv(pAVar1);
      if (pAVar1 == (AInventory *)0x0) {
        pAVar2 = GC::ReadBarrier<AInventory>((AInventory **)obj);
        do {
          pAVar1 = pAVar2;
          pAVar2 = AInventory::NextInv(pAVar1);
        } while (pAVar2 != (AInventory *)0x0);
      }
      (obj->field_0).p = pAVar1;
      if (((((byte)displaynametags.Value & 1) != 0) && (StatusBar != (DBaseStatusBar *)0x0)) &&
         (SmallFont != (FFont *)0x0)) {
        pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj);
        this = StatusBar;
        if (pAVar1 != (AInventory *)0x0) {
          this_00 = (DHUDMessageFadeOut *)DObject::operator_new(200);
          font = SmallFont;
          pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)obj);
          text = AActor::GetTag(&pAVar1->super_AActor,(char *)0x0);
          DHUDMessageFadeOut::DHUDMessageFadeOut
                    (this_00,font,text,1.5,0.8,0,0,nametagcolor.Value,2.0,0.35);
          DBaseStatusBar::AttachMessage(this,(DHUDMessage *)this_00,0x564e4953,0);
        }
      }
    }
    ((who->super_AActor).player)->inventorytics = 0xaf;
  }
  return;
}

Assistant:

CCMD (invprev)
{
	AInventory *item, *newitem;

	if (who == NULL)
		return;

	if (who->InvSel != NULL)
	{
		if ((item = who->InvSel->PrevInv()) != NULL)
		{
			who->InvSel = item;
		}
		else
		{
			// Select the last item in the inventory
			item = who->InvSel;
			while ((newitem = item->NextInv()) != NULL)
			{
				item = newitem;
			}
			who->InvSel = item;
		}
		if ((displaynametags & 1) && StatusBar && SmallFont && who->InvSel)
			StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, who->InvSel->GetTag(), 
			1.5f, 0.80f, 0, 0, (EColorRange)*nametagcolor, 2.f, 0.35f), MAKE_ID('S','I','N','V'));
	}
	who->player->inventorytics = 5*TICRATE;
}